

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
          (JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *this)

{
  bool bVar1;
  vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *in_RSI;
  PsbtMapDataStruct *in_RDI;
  PsbtMapDataStruct data;
  PsbtMapData *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *__range3;
  vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *result;
  vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
  *in_stack_ffffffffffffff28;
  PsbtMapDataStruct *__x;
  PsbtMapData *in_stack_ffffffffffffff58;
  __normal_iterator<const_cfd::api::json::PsbtMapData_*,_std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  ::std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)0x6bb5be);
  local_28[0]._M_current =
       (PsbtMapData *)
       ::std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>::
       begin(in_stack_ffffffffffffff28);
  ::std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>::end
            (in_stack_ffffffffffffff28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::json::PsbtMapData_*,_std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_cfd::api::json::PsbtMapData_*,_std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>_>
                             *)in_stack_ffffffffffffff28), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::PsbtMapData_*,_std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>_>
    ::operator*(local_28);
    cfd::api::json::PsbtMapData::ConvertToStruct(in_stack_ffffffffffffff58);
    ::std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::push_back(in_RSI,__x);
    PsbtMapDataStruct::~PsbtMapDataStruct(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::PsbtMapData_*,_std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>_>
    ::operator++(local_28);
  }
  return (vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)__x;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }